

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_compression.cpp
# Opt level: O1

void transpose_uint32_aos_to_soa(char *filename)

{
  int val;
  ulong uVar1;
  uint32_t nr_of_triangles;
  uint32_t *triangles_from_b1b2b3b4;
  uint32_t *triangles;
  uint8_t *b4;
  uint8_t *b3;
  uint8_t *b2;
  uint8_t *b1;
  float *vertices;
  uint32_t nr_of_vertices;
  uint32_t local_74;
  uint32_t *local_70;
  uint32_t *local_68;
  uint8_t *local_60;
  uint8_t *local_58;
  uint8_t *local_50;
  uint8_t *local_48;
  float *local_40;
  uint32_t local_34;
  
  val = trico_read_stl(&local_34,&local_40,&local_74,&local_68,filename);
  TestEq<int,int>(1,val,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/int_compression.cpp"
                  ,0x29,"void transpose_uint32_aos_to_soa(const char *)");
  uVar1 = (ulong)(local_74 * 3);
  local_48 = (uint8_t *)malloc(uVar1);
  local_50 = (uint8_t *)malloc(uVar1);
  local_58 = (uint8_t *)malloc(uVar1);
  local_60 = (uint8_t *)malloc(uVar1);
  (anonymous_namespace)::g_timer._0_8_ = std::chrono::_V2::system_clock::now();
  trico_transpose_uint32_aos_to_soa(&local_48,&local_50,&local_58,&local_60,local_68,local_74 * 3);
  anon_unknown.dwarf_9824::toc("transpose_uint32_aos_to_soa time: ");
  local_70 = (uint32_t *)malloc((ulong)(local_74 * 3) << 2);
  (anonymous_namespace)::g_timer._0_8_ = std::chrono::_V2::system_clock::now();
  trico_transpose_uint32_soa_to_aos(&local_70,local_48,local_50,local_58,local_60,local_74 * 3);
  anon_unknown.dwarf_9824::toc("transpose_uint32_soa_to_aos time: ");
  if (local_74 != 0) {
    uVar1 = 0;
    do {
      TestEq<unsigned_int,unsigned_int>
                (local_68[uVar1],local_70[uVar1],
                 "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/int_compression.cpp"
                 ,0x3e,"void transpose_uint32_aos_to_soa(const char *)");
      uVar1 = uVar1 + 1;
    } while (uVar1 < local_74 * 3);
  }
  free(local_70);
  free(local_48);
  free(local_50);
  free(local_58);
  free(local_60);
  free(local_40);
  free(local_68);
  return;
}

Assistant:

void transpose_uint32_aos_to_soa(const char* filename)
  {
  uint32_t nr_of_vertices;
  float* vertices;
  uint32_t nr_of_triangles;
  uint32_t* triangles;

  TEST_EQ(1, trico_read_stl(&nr_of_vertices, &vertices, &nr_of_triangles, &triangles, filename));

  uint8_t* b1 = (uint8_t*)trico_malloc(nr_of_triangles * 3);
  uint8_t* b2 = (uint8_t*)trico_malloc(nr_of_triangles * 3);
  uint8_t* b3 = (uint8_t*)trico_malloc(nr_of_triangles * 3);
  uint8_t* b4 = (uint8_t*)trico_malloc(nr_of_triangles * 3);


  tic();
  trico_transpose_uint32_aos_to_soa(&b1, &b2, &b3, &b4, triangles, nr_of_triangles * 3);
  toc("transpose_uint32_aos_to_soa time: ");


  uint32_t* triangles_from_b1b2b3b4 = (uint32_t*)trico_malloc(nr_of_triangles * 3 * sizeof(uint32_t));

  tic();
  trico_transpose_uint32_soa_to_aos(&triangles_from_b1b2b3b4, b1, b2, b3, b4, nr_of_triangles * 3);
  toc("transpose_uint32_soa_to_aos time: ");

  for (uint32_t i = 0; i < nr_of_triangles * 3; ++i)
    {
    TEST_EQ(triangles[i], triangles_from_b1b2b3b4[i]);
    }

  trico_free(triangles_from_b1b2b3b4);
  trico_free(b1);
  trico_free(b2);
  trico_free(b3);
  trico_free(b4);

  trico_free(vertices);
  trico_free(triangles);
  }